

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

optional<long> __thiscall
wallet::CCoinControl::GetInputWeight(CCoinControl *this,COutPoint *outpoint)

{
  bool bVar1;
  undefined8 extraout_RDX;
  PreselectedInput *in_RDI;
  long in_FS_OFFSET;
  _Optional_payload_base<long> _Var2;
  optional<long> oVar3;
  const_iterator it;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  *in_stack_ffffffffffffffb0;
  _Storage<long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::find(in_stack_ffffffffffffffb0,
         (key_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::end(in_stack_ffffffffffffffb0);
  bVar1 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffffb0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::optional<long>::optional((optional<long> *)&local_18);
    _Var2._8_8_ = extraout_RDX;
    _Var2._M_payload._M_value = local_18._M_value;
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_> *)
               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    _Var2 = (_Optional_payload_base<long>)PreselectedInput::GetInputWeight(in_RDI);
    local_10 = _Var2._M_engaged;
  }
  local_18 = _Var2._M_payload;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = _Var2._9_7_;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_10;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_18._M_value;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> CCoinControl::GetInputWeight(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() ? it->second.GetInputWeight() : std::nullopt;
}